

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O3

void TPZShapeHDiv<pzshape::TPZShapeCube>::ComputeVecandShape(TPZShapeData *data)

{
  pair<int,_long> *ppVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  MElementType MVar8;
  int *piVar9;
  ostream *this;
  long *plVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  int iside;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  bool bVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int maxorder [3];
  TPZGenMatrix<int> shapeorders;
  TPZManVector<long,_27> FirstIndex;
  TPZManVector<int,_10> facevector;
  TPZManVector<int,_81> vecpermute;
  TPZManVector<int,_81> VectorSides;
  TPZManVector<int,_81> normalsides;
  TPZManVector<int,_81> directions;
  TPZManVector<int,_81> bilinear;
  int local_90c [3];
  TPZVec<int> *local_900;
  ulong local_8f8;
  long local_8f0;
  ulong local_8e8;
  ulong local_8e0;
  long local_8d8;
  int local_8cc;
  long local_8c8;
  TPZManVector<int,_10> local_8c0;
  TPZManVector<long,_27> local_878;
  TPZManVector<int,_10> local_780;
  TPZVec<int> local_738;
  int local_718 [82];
  TPZVec<int> local_5d0;
  int local_5b0 [82];
  TPZVec<int> local_468;
  int local_448 [82];
  TPZVec<int> local_300;
  int local_2e0 [82];
  TPZVec<int> local_198;
  int local_178 [82];
  
  TPZVec<int>::TPZVec(&local_5d0,0);
  local_5d0._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018bd738;
  local_5d0.fStore = local_5b0;
  local_5d0.fNElements = 0x51;
  local_5d0.fNAlloc = 0;
  TPZVec<int>::TPZVec(&local_198,0);
  local_198.fStore = local_178;
  local_198._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018bd738;
  local_198.fNElements = 0x51;
  local_198.fNAlloc = 0;
  TPZVec<int>::TPZVec(&local_300,0);
  local_300.fStore = local_2e0;
  local_300._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018bd738;
  local_300.fNElements = 0x51;
  local_300.fNAlloc = 0;
  TPZVec<int>::TPZVec(&local_468,0);
  local_468.fStore = local_448;
  local_468._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018bd738;
  local_468.fNElements = 0x51;
  local_468.fNAlloc = 0;
  pztopology::TPZCube::GetSideHDivDirections(&local_5d0,&local_300,&local_198,&local_468);
  if ((data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fNElements == 0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
               ,0x6c);
  }
  local_8cc = (data->fHDivConnectOrders).super_TPZVec<int>.fStore[6];
  local_900 = &(data->fH1ConnectOrders).super_TPZVec<int>;
  iVar4 = pzshape::TPZShapeCube::NShapeF(local_900);
  local_8f8 = CONCAT44(local_8f8._4_4_,iVar4);
  local_738._vptr_TPZVec = (_func_int **)CONCAT44(local_738._vptr_TPZVec._4_4_,0x1a);
  TPZManVector<int,_10>::TPZManVector(&local_780,local_5d0.fNElements,(int *)&local_738);
  uVar15 = 0;
  TPZVec<int>::TPZVec(&local_738,0);
  local_738.fStore = local_718;
  local_738._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018bd738;
  local_738.fNElements = 0x51;
  local_738.fNAlloc = 0;
  iVar4 = 0;
  do {
    iVar5 = pztopology::TPZCube::SideDimension(iVar4);
    if (iVar5 == 2) {
      TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_8c0);
      pztopology::TPZCube::LowerDimensionSides(iVar4,(TPZStack<int,_10> *)&local_8c0);
      uVar3 = (uint)local_8c0.super_TPZVec<int>.fNElements;
      uVar7 = (uint)local_8c0.super_TPZVec<int>.fNElements + 1;
      TPZManVector<int,_27>::TPZManVector((TPZManVector<int,_27> *)&local_878,(long)(int)uVar7);
      HDivPermutation(iVar4,data,(TPZVec<int> *)&local_878);
      if (uVar3 < 0x7fffffff) {
        iVar5 = (int)uVar15;
        uVar15 = 0;
        do {
          local_738.fStore[(long)iVar5 + uVar15] =
               *(int *)((long)local_878.super_TPZVec<long>.fStore + uVar15 * 4) + iVar5;
          local_780.super_TPZVec<int>.fStore[(long)iVar5 + uVar15] = iVar4;
          uVar15 = uVar15 + 1;
        } while (uVar7 != uVar15);
        uVar15 = (ulong)(uint)(iVar5 + (int)uVar15);
      }
      if (local_878.super_TPZVec<long>.fStore != local_878.fExtAlloc) {
        local_878.super_TPZVec<long>.fNAlloc = 0;
        local_878.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
        if (local_878.super_TPZVec<long>.fStore != (long *)0x0) {
          operator_delete__(local_878.super_TPZVec<long>.fStore);
        }
      }
      TPZManVector<int,_10>::~TPZManVector(&local_8c0);
    }
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0x1b);
  lVar16 = (long)(int)uVar15;
  lVar11 = local_738.fNElements - lVar16;
  if (lVar11 != 0 && lVar16 <= local_738.fNElements) {
    lVar12 = lVar11 + -1;
    auVar19._8_4_ = (int)lVar12;
    auVar19._0_8_ = lVar12;
    auVar19._12_4_ = (int)((ulong)lVar12 >> 0x20);
    uVar13 = 0;
    auVar19 = auVar19 ^ _DAT_014d28c0;
    uVar14 = uVar15;
    do {
      auVar20._8_4_ = (int)uVar13;
      auVar20._0_8_ = uVar13;
      auVar20._12_4_ = (int)(uVar13 >> 0x20);
      auVar20 = (auVar20 | _DAT_014d28b0) ^ _DAT_014d28c0;
      iVar4 = (int)uVar14;
      if ((bool)(~(auVar20._4_4_ == auVar19._4_4_ && auVar19._0_4_ < auVar20._0_4_ ||
                  auVar19._4_4_ < auVar20._4_4_) & 1)) {
        local_738.fStore[lVar16 + uVar13] = iVar4;
      }
      if ((auVar20._12_4_ != auVar19._12_4_ || auVar20._8_4_ <= auVar19._8_4_) &&
          auVar20._12_4_ <= auVar19._12_4_) {
        local_738.fStore[lVar16 + uVar13 + 1] = iVar4 + 1;
      }
      uVar13 = uVar13 + 2;
      uVar14 = (ulong)(iVar4 + 2);
    } while ((lVar11 + 1U & 0xfffffffffffffffe) != uVar13);
  }
  TPZGenMatrix<int>::TPZGenMatrix((TPZGenMatrix<int> *)&local_8c0,(long)(int)local_8f8,3);
  pzshape::TPZShapeCube::ShapeOrder
            (&(data->fCornerNodeIds).super_TPZVec<long>,local_900,(TPZGenMatrix<int> *)&local_8c0);
  iVar4 = (data->fHDivConnectOrders).super_TPZVec<int>.fStore[6];
  TPZManVector<long,_27>::TPZManVector(&local_878,0x1c);
  *local_878.super_TPZVec<long>.fStore = 0;
  iVar5 = 0;
  uVar14 = 0;
  do {
    iVar6 = 1;
    if (7 < uVar14) {
      iVar6 = iVar4 + 1;
    }
    iVar6 = pzshape::TPZShapeCube::NConnectShapeF((int)uVar14,iVar6);
    iVar5 = iVar5 + iVar6;
    local_878.super_TPZVec<long>.fStore[uVar14 + 1] = (long)iVar5;
    uVar14 = uVar14 + 1;
  } while (uVar14 != 0x1b);
  local_8c8 = local_5d0.fNElements;
  local_8f0 = lVar16;
  if ((int)uVar15 < 1) {
    uVar14 = 0;
  }
  else {
    uVar13 = 0;
    uVar14 = 0;
    local_8e8 = uVar15;
    do {
      local_8d8 = (long)local_738.fStore[uVar13];
      local_900 = (TPZVec<int> *)(long)local_5d0.fStore[local_8d8];
      lVar11 = local_878.super_TPZVec<long>.fStore[(long)((long)&local_900->_vptr_TPZVec + 1)];
      local_8e0 = uVar13;
      if ((int)local_878.super_TPZVec<long>.fStore[(long)local_900] < (int)lVar11) {
        iVar4 = (data->fHDivConnectOrders).super_TPZVec<int>.fStore
                [(long)local_780.super_TPZVec<int>.fStore[uVar13] + -0x14];
        lVar16 = (long)(int)local_878.super_TPZVec<long>.fStore[(long)local_900];
        do {
          uVar7 = pztopology::TPZCube::SideDimension((int)local_900);
          if ((int)uVar7 < 1) {
LAB_01009795:
            iVar5 = (int)uVar14;
            ppVar1 = (data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fStore;
            ppVar1[iVar5].first = (int)local_8d8;
            ppVar1[iVar5].second = lVar16;
            uVar14 = (ulong)(iVar5 + 1);
          }
          else {
            bVar2 = true;
            uVar15 = 0;
            local_8f8 = uVar14;
            do {
              piVar9 = TPZGenMatrix<int>::operator()((TPZGenMatrix<int> *)&local_8c0,lVar16,uVar15);
              if (iVar4 < *piVar9) {
                bVar2 = false;
              }
              uVar15 = uVar15 + 1;
            } while (uVar7 != uVar15);
            uVar14 = local_8f8;
            if (bVar2) goto LAB_01009795;
          }
          lVar16 = lVar16 + 1;
        } while ((int)lVar16 != (int)lVar11);
      }
      uVar13 = local_8e0 + 1;
    } while (uVar13 != local_8e8);
  }
  lVar11 = local_8f0;
  if (local_8f0 < local_8c8) {
    do {
      local_8d8 = (long)local_738.fStore[lVar11];
      iVar4 = local_5d0.fStore[local_8d8];
      local_900 = (TPZVec<int> *)CONCAT44(local_900._4_4_,local_198.fStore[local_8d8]);
      local_8e0 = (ulong)local_300.fStore[local_8d8];
      local_8f0 = lVar11;
      MVar8 = pztopology::TPZCube::Type(iVar4);
      lVar11 = local_878.super_TPZVec<long>.fStore[(long)iVar4 + 1];
      if ((int)local_878.super_TPZVec<long>.fStore[iVar4] < (int)lVar11) {
        lVar16 = (long)(int)local_878.super_TPZVec<long>.fStore[iVar4];
        local_8e8 = CONCAT44(local_8e8._4_4_,iVar4);
        do {
          uVar7 = pztopology::TPZCube::SideDimension(iVar4);
          local_90c[0] = local_8cc;
          local_90c[1] = local_8cc;
          local_90c[2] = local_8cc;
          if ((int)local_900 != 0) {
            local_90c[local_8e0] = local_90c[local_8e0] + 1;
          }
          if ((int)uVar7 < 1) {
LAB_01009972:
            iVar5 = (int)uVar14;
            ppVar1 = (data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fStore;
            ppVar1[iVar5].first = (int)local_8d8;
            ppVar1[iVar5].second = lVar16;
            uVar14 = (ulong)(iVar5 + 1);
          }
          else {
            bVar2 = true;
            uVar15 = 0;
            local_8f8 = uVar14;
            do {
              switch(MVar8) {
              case EOned:
                piVar9 = TPZGenMatrix<int>::operator()((TPZGenMatrix<int> *)&local_8c0,lVar16,0);
                break;
              case ETriangle:
              case ETetraedro:
                piVar9 = TPZGenMatrix<int>::operator()
                                   ((TPZGenMatrix<int> *)&local_8c0,lVar16,uVar15);
                iVar6 = local_90c[uVar15] + 1;
                iVar4 = *piVar9;
                bVar18 = SBORROW4(iVar4,iVar6);
                iVar5 = iVar4 - iVar6;
                bVar17 = iVar4 == iVar6;
                goto LAB_01009949;
              case EQuadrilateral:
                piVar9 = TPZGenMatrix<int>::operator()
                                   ((TPZGenMatrix<int> *)&local_8c0,lVar16,uVar15);
                break;
              case EPiramide:
                piVar9 = TPZGenMatrix<int>::operator()
                                   ((TPZGenMatrix<int> *)&local_8c0,lVar16,uVar15);
                break;
              case EPrisma:
                piVar9 = TPZGenMatrix<int>::operator()
                                   ((TPZGenMatrix<int> *)&local_8c0,lVar16,uVar15);
                break;
              case ECube:
                piVar9 = TPZGenMatrix<int>::operator()
                                   ((TPZGenMatrix<int> *)&local_8c0,lVar16,uVar15);
                break;
              default:
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
                           ,0x104);
              }
              iVar6 = *piVar9;
              iVar4 = local_90c[uVar15];
              bVar18 = SBORROW4(iVar6,iVar4);
              iVar5 = iVar6 - iVar4;
              bVar17 = iVar6 == iVar4;
LAB_01009949:
              if (!bVar17 && bVar18 == iVar5 < 0) {
                bVar2 = false;
              }
              uVar15 = uVar15 + 1;
            } while (uVar7 != uVar15);
            uVar14 = local_8f8;
            iVar4 = (int)local_8e8;
            if (bVar2) goto LAB_01009972;
          }
          lVar16 = lVar16 + 1;
        } while ((int)lVar16 != (int)lVar11);
      }
      lVar11 = local_8f0 + 1;
    } while (local_8f0 + 1 < local_8c8);
  }
  iVar4 = (int)(data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fNElements;
  if ((int)uVar14 == iVar4) {
    if (local_878.super_TPZVec<long>.fStore != local_878.fExtAlloc) {
      local_878.super_TPZVec<long>.fNAlloc = 0;
      local_878.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
      if (local_878.super_TPZVec<long>.fStore != (long *)0x0) {
        operator_delete__(local_878.super_TPZVec<long>.fStore);
      }
    }
    TPZGenMatrix<int>::~TPZGenMatrix((TPZGenMatrix<int> *)&local_8c0);
    if (local_738.fStore != local_718) {
      local_738.fNAlloc = 0;
      local_738._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
      if (local_738.fStore != (int *)0x0) {
        operator_delete__(local_738.fStore);
      }
    }
    TPZManVector<int,_10>::~TPZManVector(&local_780);
    if (local_468.fStore != local_448) {
      local_468.fNAlloc = 0;
      local_468._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
      if (local_468.fStore != (int *)0x0) {
        operator_delete__(local_468.fStore);
      }
    }
    if (local_300.fStore != local_2e0) {
      local_300.fNAlloc = 0;
      local_300._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
      if (local_300.fStore != (int *)0x0) {
        operator_delete__(local_300.fStore);
      }
    }
    if (local_198.fStore != local_178) {
      local_198.fNAlloc = 0;
      local_198._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
      if (local_198.fStore != (int *)0x0) {
        operator_delete__(local_198.fStore);
      }
    }
    if (local_5d0.fStore != local_5b0) {
      local_5d0.fNAlloc = 0;
      local_5d0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
      if (local_5d0.fStore != (int *)0x0) {
        operator_delete__(local_5d0.fStore);
      }
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"count ",6);
  this = (ostream *)std::ostream::operator<<(&std::cout,(int)uVar14);
  std::__ostream_insert<char,std::char_traits<char>>(this,"\nivs ",5);
  plVar10 = (long *)std::ostream::operator<<(this,iVar4);
  std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
  std::ostream::put((char)plVar10);
  std::ostream::flush();
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
             ,0x113);
}

Assistant:

void TPZShapeHDiv<TSHAPE>::ComputeVecandShape(TPZShapeData &data) {
    const int64_t numvec = TSHAPE::Dimension*TSHAPE::NSides;
    TPZManVector<int,numvec> VectorSides(numvec),bilinear(numvec),directions(numvec);
    TPZManVector<int,numvec> normalsides(numvec);

    TSHAPE::GetSideHDivDirections(VectorSides,directions,bilinear,normalsides);

    if (data.fSDVecShapeIndex.size() == 0) {
        DebugStop();
    }
    
    // const int pressureorder = data.fHDivConnectOrders[TSHAPE::NFacets];//TODOPHIL
    const int pressureorder = data.fHDivConnectOrders[TSHAPE::NFacets];

    int nshape = TSHAPE::NShapeF(data.fH1ConnectOrders);

    int nexternalvectors = 0;
    TPZManVector<int> facevector(VectorSides.size(),TSHAPE::NSides-1);
    // compute the permutation which needs to be applied to the vectors to enforce compatibility between neighbours
    TPZManVector<int,81> vecpermute(TSHAPE::NSides*TSHAPE::Dimension);
    if (TSHAPE::Type() == EPiramide) {
        DebugStop();
    }
    int count = 0;
    for (int side = 0; side < TSHAPE::NSides; side++) {
        if (TSHAPE::SideDimension(side) != TSHAPE::Dimension -1) {
            continue;
        }
        TPZStack<int> smallsides;
        TSHAPE::LowerDimensionSides(side,smallsides);
//        TPZGeoElSide gelside(gel,side);
//        int nlowdim = gelside.NSides();
        const int nlowdim = smallsides.NElements()+1;
        TPZManVector<int,27> permgather(nlowdim);
        HDivPermutation(side,data, permgather);
        int counthold = count;
        for (int i=0; i<nlowdim; i++) {
            vecpermute[counthold+i] = permgather[i]+counthold;
            facevector[count] = side;
            count++;
        }
    }

    nexternalvectors = count;
    for (; count < vecpermute.size(); count++) {
        vecpermute[count] = count;
    }
    TPZGenMatrix<int> shapeorders(nshape,3);
    TSHAPE::ShapeOrder(data.fCornerNodeIds, data.fH1ConnectOrders, shapeorders);

//    int nshapeflux = NFluxShapeF();
//    IndexVecShape.Resize(nshapeflux);

    int scalarorder = data.fHDivConnectOrders[TSHAPE::NFacets]+1;
    // VectorSide indicates the side associated with each vector entry
    TPZManVector<int64_t,27> FirstIndex(TSHAPE::NSides+1);
    // the first index of the shape functions
    FirstShapeIndex(FirstIndex,scalarorder);

    int64_t nvec = VectorSides.NElements();
    count = 0;

    const int firstface = TSHAPE::NSides-TSHAPE::NFacets-1;
    for (int locvec = 0; locvec<nexternalvectors; locvec++) {
        int ivec = vecpermute[locvec];
        int side = VectorSides[ivec];
        int face = facevector[locvec];
//        int connectindex = SideConnectLocId(0, face);
        int connectindex = face-firstface;
//        int order = this->Connect(connectindex).Order();
        //int order = data.fHDivConnectOrders[connectindex];
        int order = data.fHDivConnectOrders[connectindex];//TODOPHIL

        int firstshape = FirstIndex[side];
        int lastshape = FirstIndex[side+1];

        for (int ish = firstshape; ish<lastshape; ish++) {
            int sidedimension = TSHAPE::SideDimension(side);
            int include=true;
            for (int d=0; d<sidedimension; d++)
            {
                if (shapeorders(ish,d) > order) {
                    include = false;
                }
            }
            if (include)
            {
                data.fSDVecShapeIndex[count] = std::make_pair(ivec, ish);
                count++;
            }
        }
    }


    for (int locvec = nexternalvectors; locvec<nvec; locvec++) {
        int ivec = vecpermute[locvec];
        int side = VectorSides[ivec];
        int bil = bilinear[ivec];
        int dir = directions[ivec];
        MElementType tipo = TSHAPE::Type(side);

        int firstshape = FirstIndex[side];
        int lastshape = FirstIndex[side+1];

        for (int ish = firstshape; ish<lastshape; ish++) {
            int sidedimension = TSHAPE::SideDimension(side);
            int maxorder[3] = {pressureorder,pressureorder,pressureorder};
            if (bil) {
                maxorder[dir]++;
            }
            int shord[3] = {0};
            int include=true;
            for (int d=0; d<sidedimension; d++)
            {
                if (tipo==ETriangle||tipo==ETetraedro)//
                {
                    shord[d] = shapeorders(ish,d);
                    int maxd = maxorder[d]+1;
                    if (shord[d] > maxd) {
                        include = false;
                    }
                }
                else if(tipo==EQuadrilateral)
                {
                    shord[d] = shapeorders(ish,d);
                    int maxd = maxorder[d];
                    if (shord[d] > maxd) {
                        include = false;
                    }
                }
                else if(tipo==ECube)
                {
                    shord[d] = shapeorders(ish,d);
                    if (shord[d] > maxorder[d]) {
                        include = false;
                    }
                }
                else if (tipo==EPrisma)
                {
                    //DebugStop();
                    if (shapeorders(ish,d) > maxorder[d]) {
                        include = false;
                    }
                }
                else if (tipo == EOned)
                {
                    shord[0] = shapeorders(ish,0);
                    if (shord[0] > maxorder[d]) {
                        include = false;
                    }
                }
                else if (tipo == EPiramide)
                {
                    shord[d] = shapeorders(ish,d);
                    if (shord[d] > maxorder[d]) {
                        include = false;
                    }
                }
                else
                {
                    DebugStop();
                }
            }
            if (include)
            {
                data.fSDVecShapeIndex[count] = std::make_pair(ivec, ish);
                count++;
            }
        }
    }

    int ivs =  data.fSDVecShapeIndex.size();
    if (count != ivs) {
        std::cout<<"count "<<count
                 <<"\nivs "<<ivs<<std::endl;
        DebugStop();
    }
    
}